

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::DefaultsTest::CheckValue<long>
          (DefaultsTest *this,long value,long reference_value,GLchar *pname_string,
          GLchar *function_string)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  
  if (reference_value != value) {
    local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    iVar1 = (int)(ostringstream *)&local_1a0;
    if (function_string == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a0[-3]);
    }
    else {
      sVar2 = strlen(function_string);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,function_string,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," called with ",0xd);
    if (pname_string == (GLchar *)0x0) {
      std::ios::clear(iVar1 + (int)local_1a0[-3]);
    }
    else {
      sVar2 = strlen(pname_string);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pname_string,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0," parameter name returned ",0x19);
    std::ostream::_M_insert<long>((long)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,", but ",6);
    std::ostream::_M_insert<long>((long)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," was expected.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return reference_value == value;
}

Assistant:

bool DefaultsTest::CheckValue(const T value, const T reference_value, const glw::GLchar* pname_string,
							  const glw::GLchar* function_string)
{
	if (reference_value != value)
	{
		/* Log. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function_string << " called with "
											<< pname_string << " parameter name returned " << value << ", but "
											<< reference_value << " was expected." << tcu::TestLog::EndMessage;

		return false;
	}
	return true;
}